

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O1

void __thiscall kratos::Var::set_width_param(Var *this,Var *param)

{
  uint64_t uVar1;
  long *plVar2;
  undefined1 local_b8 [8];
  ParamVisitor visitor;
  
  if (param == (Var *)0x0) {
    if (this->width_param_ != (Var *)0x0) {
      visitor.super_IRVisitor._8_8_ =
           &visitor.super_IRVisitor.visited_._M_h._M_rehash_policy._M_next_resize;
      visitor.super_IRVisitor._vptr_IRVisitor._0_4_ = 0;
      visitor.super_IRVisitor.visited_._M_h._M_buckets = (__buckets_ptr)0x1;
      visitor.super_IRVisitor.visited_._M_h._M_bucket_count = 0;
      visitor.super_IRVisitor.visited_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      visitor.super_IRVisitor.visited_._M_h._M_element_count._0_4_ = 0x3f800000;
      visitor.super_IRVisitor.visited_._M_h._M_rehash_policy._M_max_load_factor = 0.0;
      visitor.super_IRVisitor.visited_._M_h._M_rehash_policy._4_4_ = 0;
      visitor.super_IRVisitor.visited_._M_h._M_rehash_policy._M_next_resize = 0;
      local_b8 = (undefined1  [8])&PTR_visit_root_002b8fe8;
      visitor.super_IRVisitor.visited_._M_h._M_single_bucket =
           (__node_base_ptr)&visitor.params_._M_h._M_rehash_policy._M_next_resize;
      visitor.params_._M_h._M_buckets = (__buckets_ptr)0x1;
      visitor.params_._M_h._M_bucket_count = 0;
      visitor.params_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      visitor.params_._M_h._M_element_count._0_4_ = 0x3f800000;
      visitor.params_._M_h._M_rehash_policy._M_max_load_factor = 0.0;
      visitor.params_._M_h._M_rehash_policy._4_4_ = 0;
      visitor.params_._M_h._M_rehash_policy._M_next_resize = 0;
      IRVisitor::visit_root((IRVisitor *)local_b8,&this->width_param_->super_IRNode);
      if (visitor.params_._M_h._M_bucket_count != 0) {
        plVar2 = (long *)visitor.params_._M_h._M_bucket_count;
        do {
          visitor.params_._M_h._M_single_bucket = (__node_base_ptr)this;
          std::
          _Hashtable<kratos::Var*,kratos::Var*,std::allocator<kratos::Var*>,std::__detail::_Identity,std::equal_to<kratos::Var*>,std::hash<kratos::Var*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
          ::_M_emplace<kratos::Var*&>
                    ((_Hashtable<kratos::Var*,kratos::Var*,std::allocator<kratos::Var*>,std::__detail::_Identity,std::equal_to<kratos::Var*>,std::hash<kratos::Var*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                      *)(plVar2[1] + 0x2c8),&visitor.params_._M_h._M_single_bucket);
          plVar2 = (long *)*plVar2;
        } while (plVar2 != (long *)0x0);
      }
      local_b8 = (undefined1  [8])&PTR_visit_root_002b8fe8;
      std::
      _Hashtable<kratos::Param_*,_kratos::Param_*,_std::allocator<kratos::Param_*>,_std::__detail::_Identity,_std::equal_to<kratos::Param_*>,_std::hash<kratos::Param_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
      ::~_Hashtable((_Hashtable<kratos::Param_*,_kratos::Param_*,_std::allocator<kratos::Param_*>,_std::__detail::_Identity,_std::equal_to<kratos::Param_*>,_std::hash<kratos::Param_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                     *)&visitor.super_IRVisitor.visited_._M_h._M_single_bucket);
      local_b8 = (undefined1  [8])&PTR_visit_root_002bb060;
      std::
      _Hashtable<kratos::IRNode_*,_kratos::IRNode_*,_std::allocator<kratos::IRNode_*>,_std::__detail::_Identity,_std::equal_to<kratos::IRNode_*>,_std::hash<kratos::IRNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
      ::~_Hashtable((_Hashtable<kratos::IRNode_*,_kratos::IRNode_*,_std::allocator<kratos::IRNode_*>,_std::__detail::_Identity,_std::equal_to<kratos::IRNode_*>,_std::hash<kratos::IRNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                     *)&visitor.super_IRVisitor.level);
    }
    this->width_param_ = (Var *)0x0;
  }
  else {
    uVar1 = Simulator::static_evaluate_expr(param);
    this->var_width_ = (uint32_t)uVar1;
    this->width_param_ = param;
    visitor.super_IRVisitor._8_8_ =
         &visitor.super_IRVisitor.visited_._M_h._M_rehash_policy._M_next_resize;
    visitor.super_IRVisitor._vptr_IRVisitor._0_4_ = 0;
    visitor.super_IRVisitor.visited_._M_h._M_buckets = (__buckets_ptr)0x1;
    visitor.super_IRVisitor.visited_._M_h._M_bucket_count = 0;
    visitor.super_IRVisitor.visited_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    visitor.super_IRVisitor.visited_._M_h._M_element_count._0_4_ = 0x3f800000;
    visitor.super_IRVisitor.visited_._M_h._M_rehash_policy._M_max_load_factor = 0.0;
    visitor.super_IRVisitor.visited_._M_h._M_rehash_policy._4_4_ = 0;
    visitor.super_IRVisitor.visited_._M_h._M_rehash_policy._M_next_resize = 0;
    local_b8 = (undefined1  [8])&PTR_visit_root_002b8fe8;
    visitor.super_IRVisitor.visited_._M_h._M_single_bucket =
         (__node_base_ptr)&visitor.params_._M_h._M_rehash_policy._M_next_resize;
    visitor.params_._M_h._M_buckets = (__buckets_ptr)0x1;
    visitor.params_._M_h._M_bucket_count = 0;
    visitor.params_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    visitor.params_._M_h._M_element_count._0_4_ = 0x3f800000;
    visitor.params_._M_h._M_rehash_policy._M_max_load_factor = 0.0;
    visitor.params_._M_h._M_rehash_policy._4_4_ = 0;
    visitor.params_._M_h._M_rehash_policy._M_next_resize = 0;
    IRVisitor::visit_root((IRVisitor *)local_b8,&param->super_IRNode);
    if (visitor.params_._M_h._M_bucket_count != 0) {
      plVar2 = (long *)visitor.params_._M_h._M_bucket_count;
      do {
        visitor.params_._M_h._M_single_bucket = (__node_base_ptr)this;
        std::
        _Hashtable<kratos::Var*,kratos::Var*,std::allocator<kratos::Var*>,std::__detail::_Identity,std::equal_to<kratos::Var*>,std::hash<kratos::Var*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
        ::_M_emplace<kratos::Var*&>
                  ((_Hashtable<kratos::Var*,kratos::Var*,std::allocator<kratos::Var*>,std::__detail::_Identity,std::equal_to<kratos::Var*>,std::hash<kratos::Var*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                    *)(plVar2[1] + 0x2c8),&visitor.params_._M_h._M_single_bucket);
        plVar2 = (long *)*plVar2;
      } while (plVar2 != (long *)0x0);
    }
    local_b8 = (undefined1  [8])&PTR_visit_root_002b8fe8;
    std::
    _Hashtable<kratos::Param_*,_kratos::Param_*,_std::allocator<kratos::Param_*>,_std::__detail::_Identity,_std::equal_to<kratos::Param_*>,_std::hash<kratos::Param_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::~_Hashtable((_Hashtable<kratos::Param_*,_kratos::Param_*,_std::allocator<kratos::Param_*>,_std::__detail::_Identity,_std::equal_to<kratos::Param_*>,_std::hash<kratos::Param_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                   *)&visitor.super_IRVisitor.visited_._M_h._M_single_bucket);
    local_b8 = (undefined1  [8])&PTR_visit_root_002bb060;
    std::
    _Hashtable<kratos::IRNode_*,_kratos::IRNode_*,_std::allocator<kratos::IRNode_*>,_std::__detail::_Identity,_std::equal_to<kratos::IRNode_*>,_std::hash<kratos::IRNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::~_Hashtable((_Hashtable<kratos::IRNode_*,_kratos::IRNode_*,_std::allocator<kratos::IRNode_*>,_std::__detail::_Identity,_std::equal_to<kratos::IRNode_*>,_std::hash<kratos::IRNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                   *)&visitor.super_IRVisitor.level);
  }
  return;
}

Assistant:

void Var::set_width_param(Var *param) {
    if (param == nullptr) {
        if (width_param_) {
            ParamVisitor visitor;
            visitor.visit_root(width_param_);
            auto const &params = visitor.params();
            for (const auto &p : params) {
                p->add_param_width_var(this);
            }
        }
        width_param_= nullptr;
        return;
    }
    // set width to the current param value
    auto value = Simulator::static_evaluate_expr(param);
    var_width_ = value;
    width_param_ = param;

    // get all the parameters
    ParamVisitor visitor;
    visitor.visit_root(param);
    auto const &params = visitor.params();
    for (const auto &p : params) {
        p->add_param_width_var(this);
    }
}